

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O0

GCfunc * func_newL(lua_State *L,GCproto *pt,GCtab *env)

{
  uint uVar1;
  GCfunc *pGVar2;
  undefined8 in_RDX;
  lua_State *in_RSI;
  GCfunc *fn;
  uint32_t count;
  
  pGVar2 = (GCfunc *)lj_mem_newgco(in_RSI,(GCSize)((ulong)in_RDX >> 0x20));
  (pGVar2->c).gct = '\b';
  (pGVar2->c).ffid = '\0';
  (pGVar2->c).nupvalues = '\0';
  (pGVar2->c).pc.ptr32 = (int)in_RSI + 0x40;
  (pGVar2->c).env.gcptr32 = (uint32_t)in_RDX;
  uVar1 = *(byte *)((long)&(in_RSI->stack).ptr32 + 1) + 0x20;
  *(byte *)((long)&(in_RSI->stack).ptr32 + 1) = (char)uVar1 - ((byte)(uVar1 >> 3) & 0x20);
  return pGVar2;
}

Assistant:

static GCfunc *func_newL(lua_State *L, GCproto *pt, GCtab *env)
{
  uint32_t count;
  GCfunc *fn = (GCfunc *)lj_mem_newgco(L, sizeLfunc((MSize)pt->sizeuv));
  fn->l.gct = ~LJ_TFUNC;
  fn->l.ffid = FF_LUA;
  fn->l.nupvalues = 0;  /* Set to zero until upvalues are initialized. */
  /* NOBARRIER: Really a setgcref. But the GCfunc is new (marked white). */
  setmref(fn->l.pc, proto_bc(pt));
  setgcref(fn->l.env, obj2gco(env));
  /* Saturating 3 bit counter (0..7) for created closures. */
  count = (uint32_t)pt->flags + PROTO_CLCOUNT;
  pt->flags = (uint8_t)(count - ((count >> PROTO_CLC_BITS) & PROTO_CLCOUNT));
  return fn;
}